

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O1

void anon_unknown.dwarf_ec09::eatExpectedString(istream *in,char *str)

{
  char cVar1;
  istream *piVar2;
  runtime_error *this;
  char *pcVar3;
  char c;
  string msg;
  char local_39;
  undefined1 *local_38;
  ulong local_30;
  undefined1 local_28 [16];
  
  if (*str != '\0') {
    pcVar3 = str + 1;
    do {
      piVar2 = std::operator>>(in,&local_39);
      if ((((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) ||
         (local_39 != pcVar3[-1])) {
        local_38 = local_28;
        local_30 = 0;
        local_28[0] = 0;
        std::__cxx11::string::append((char *)&local_38);
        std::__cxx11::string::_M_replace_aux((ulong)&local_38,local_30,0,'\x01');
        std::__cxx11::string::append((char *)&local_38);
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,(string *)&local_38);
        *(undefined ***)this = &PTR__runtime_error_00113b28;
        __cxa_throw(this,&(anonymous_namespace)::KatException::typeinfo,
                    std::runtime_error::~runtime_error);
      }
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
  }
  return;
}

Assistant:

void eatExpectedString(std::istream &in, const char *str)
    {
        char c;
        while (*str != '\0')
        {
            if (!(in >> c) || c != *str)
            {
                std::string msg;
                msg.append("unexpected character '");
                msg.append(1, c);
                msg.append("'");
                throw KatException(msg);
            }
            ++str;
        }
    }